

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::UpdateActiveFunctionsForOneDataSet
          (FunctionBody *this,ActiveFunctionSet *pActiveFuncs,FunctionCodeGenRuntimeData *parentData
          ,Type *dataSet,uint count)

{
  FunctionCodeGenRuntimeData *this_00;
  FunctionBody *this_01;
  ulong uVar1;
  Type *pTVar2;
  
  for (uVar1 = 0; uVar1 != count; uVar1 = uVar1 + 1) {
    pTVar2 = dataSet + uVar1;
    while (this_00 = pTVar2->ptr, this_00 != (FunctionCodeGenRuntimeData *)0x0) {
      if (this_00 != parentData) {
        this_01 = FunctionCodeGenRuntimeData::GetFunctionBody(this_00);
        UpdateActiveFunctionSet(this_01,pActiveFuncs,this_00);
      }
      pTVar2 = &this_00->next;
    }
  }
  return;
}

Assistant:

void FunctionBody::UpdateActiveFunctionsForOneDataSet(ActiveFunctionSet *pActiveFuncs, FunctionCodeGenRuntimeData *parentData, Field(FunctionCodeGenRuntimeData*)* dataSet, uint count) const
    {
        FunctionCodeGenRuntimeData *inlineeData;
        for (uint i = 0; i < count; i++)
        {
            for (inlineeData = dataSet[i]; inlineeData; inlineeData = inlineeData->GetNext())
            {
                // inlineeData == parentData indicates a cycle in the structure. We've already processed parentData, so don't descend.
                if (inlineeData != parentData)
                {
                    inlineeData->GetFunctionBody()->UpdateActiveFunctionSet(pActiveFuncs, inlineeData);
                }
            }
        }
    }